

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O0

void Qentem::Digit::formatStringNumberDefault<Qentem::StringStream<char16_t>>
               (StringStream<char16_t> *stream,SizeT started_at,SizeT32 precision,
               SizeT32 calculated_digits,SizeT32 fraction_length,bool is_positive_exp,bool round_up)

{
  SizeT SVar1;
  uint uVar2;
  char16_t *pcVar3;
  bool bVar4;
  uint local_9c;
  int local_94;
  SizeT needed;
  SizeT rem;
  SizeT zeros;
  SizeT diff_1;
  bool fraction_only;
  SizeT dot_index;
  Char_T *last_1;
  Char_T *number_1;
  Char_T *last;
  Char_T *number;
  bool local_3d;
  SizeT diff;
  uint uStack_38;
  bool power_increased;
  SizeT power;
  SizeT index;
  SizeT number_length;
  Char_T *storage;
  SizeT32 local_20;
  bool round_up_local;
  SizeT32 SStack_1c;
  bool is_positive_exp_local;
  SizeT32 fraction_length_local;
  SizeT32 calculated_digits_local;
  SizeT32 precision_local;
  SizeT started_at_local;
  StringStream<char16_t> *stream_local;
  
  storage._6_1_ = round_up;
  storage._7_1_ = is_positive_exp;
  local_20 = fraction_length;
  SStack_1c = calculated_digits;
  fraction_length_local = precision;
  calculated_digits_local = started_at;
  _precision_local = stream;
  _index = StringStream<char16_t>::Storage(stream);
  SVar1 = StringStream<char16_t>::Length(_precision_local);
  power = SVar1 - calculated_digits_local;
  uStack_38 = calculated_digits_local;
  diff = 0;
  local_3d = false;
  if (fraction_length_local < power) {
    uStack_38 = (power - fraction_length_local) + (calculated_digits_local - 1);
    roundStringNumber<Qentem::StringStream<char16_t>>
              (_precision_local,&stack0xffffffffffffffc8,&local_3d,(bool)(storage._6_1_ & 1));
    if ((storage._7_1_ & 1) != 0) {
      if (fraction_length_local < SStack_1c) {
        local_94 = SStack_1c - (fraction_length_local + 1);
      }
      else {
        local_94 = 0;
      }
      uVar2 = ((power - local_20) + local_94) - (uint)((local_3d ^ 0xffU) & 1);
      if (fraction_length_local <= uVar2) {
        last = _index + uStack_38;
        pcVar3 = StringStream<char16_t>::Last(_precision_local);
        while( true ) {
          bVar4 = false;
          if (last < pcVar3) {
            bVar4 = *last == L'0';
          }
          if (!bVar4) break;
          last = last + 1;
          uStack_38 = uStack_38 + 1;
        }
        local_20 = 0;
        diff = uVar2;
      }
    }
  }
  if (local_20 != 0) {
    last_1 = _index + uStack_38;
    pcVar3 = StringStream<char16_t>::Last(_precision_local);
    while( true ) {
      bVar4 = false;
      if (last_1 < pcVar3) {
        bVar4 = *last_1 == L'0';
      }
      if (!bVar4) break;
      last_1 = last_1 + 1;
      uStack_38 = uStack_38 + 1;
    }
    if (local_20 < power) {
      if (uStack_38 < calculated_digits_local + local_20) {
        StringStream<char16_t>::InsertAt(_precision_local,L'.',calculated_digits_local + local_20);
      }
      else {
        needed = 0;
        if ((local_3d & 1U) == 0) {
          if (power - SStack_1c < uStack_38 - calculated_digits_local) {
            needed = (uStack_38 - calculated_digits_local) - (power - SStack_1c);
          }
        }
        else {
          needed = power - local_20;
        }
        for (; needed != 0; needed = needed - 1) {
          uStack_38 = uStack_38 - 1;
          _index[uStack_38] = L'0';
        }
      }
    }
    else {
      if (power < local_20) {
        local_9c = local_20 - power;
      }
      else {
        local_9c = 0;
      }
      if ((local_3d & 1U) == 0) {
        if (local_9c < 4) {
          insertZeros<Qentem::StringStream<char16_t>>(_precision_local,local_9c);
          StringStream<char16_t>::operator+=(_precision_local,L'.');
          StringStream<char16_t>::operator+=(_precision_local,L'0');
        }
        else {
          diff = local_9c + 1;
        }
      }
      else if ((local_9c == 0) || (4 < local_9c)) {
        diff = local_9c;
      }
      else {
        insertZeros<Qentem::StringStream<char16_t>>(_precision_local,local_9c - 1);
        StringStream<char16_t>::operator+=(_precision_local,L'.');
        StringStream<char16_t>::operator+=(_precision_local,L'0');
      }
    }
  }
  StringStream<char16_t>::Reverse(_precision_local,calculated_digits_local);
  StringStream<char16_t>::StepBack(_precision_local,uStack_38 - calculated_digits_local);
  if (diff != 0) {
    StringStream<char16_t>::InsertAt(_precision_local,L'.',calculated_digits_local + 1);
    insertPowerOfTen<Qentem::StringStream<char16_t>>
              (_precision_local,diff,(bool)(storage._7_1_ & 1));
  }
  return;
}

Assistant:

static void formatStringNumberDefault(Stream_T &stream, const SizeT started_at, const SizeT32 precision,
                                          const SizeT32 calculated_digits, SizeT32 fraction_length,
                                          const bool is_positive_exp, const bool round_up) {
        using Char_T                = typename Stream_T::CharType;
        Char_T     *storage         = stream.Storage();
        const SizeT number_length   = (stream.Length() - started_at);
        SizeT       index           = started_at;
        SizeT       power           = 0;
        bool        power_increased = false;
        /////////////////////////////////////////////////////
        if (number_length > precision) {
            --index;
            index += SizeT(number_length - precision);

            roundStringNumber(stream, index, power_increased, round_up);

            if (is_positive_exp) {
                const SizeT diff =
                    SizeT(((number_length - fraction_length) +
                           ((calculated_digits <= precision) ? 0 : (calculated_digits - (precision + SizeT{1})))) -
                          SizeT(!power_increased));

                if (diff >= precision) {
                    Char_T       *number = (storage + index);
                    const Char_T *last   = stream.Last();

                    while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                        ++number;
                        ++index;
                    }

                    power           = diff;
                    fraction_length = 0;
                }
            }
        }

        if (fraction_length != 0) {
            Char_T       *number        = (storage + index);
            const Char_T *last          = stream.Last();
            const SizeT   dot_index     = SizeT(started_at + fraction_length);
            const bool    fraction_only = (number_length <= fraction_length);

            while ((number < last) && (*number == DigitUtils::DigitChar::Zero)) {
                ++number;
                ++index;
            }

            if (fraction_only) {
                const SizeT diff = SizeT((fraction_length > number_length) ? (fraction_length - number_length) : 0);

                if (!power_increased) {
                    if (diff < SizeT{4}) {
                        insertZeros(stream, diff);
                        stream += DigitUtils::DigitChar::Dot;
                        stream += DigitUtils::DigitChar::Zero;
                    } else {
                        power = diff;
                        ++power;
                    }
                } else if ((diff != 0) && (diff < SizeT{5})) {
                    insertZeros(stream, (diff - SizeT{1}));
                    stream += DigitUtils::DigitChar::Dot;
                    stream += DigitUtils::DigitChar::Zero;
                } else {
                    power = diff;
                }
            } else if (index < dot_index) {
                stream.InsertAt(DigitUtils::DigitChar::Dot, dot_index);
            } else {
                SizeT zeros = 0;

                if (power_increased) {
                    zeros = SizeT(number_length - fraction_length);
                } else {
                    const SizeT rem    = (index - started_at);
                    const SizeT needed = SizeT(number_length - calculated_digits);

                    if (rem > needed) {
                        zeros = (rem - needed);
                    }
                }

                while (zeros != 0) {
                    --index;
                    storage[index] = DigitUtils::DigitChar::Zero;
                    --zeros;
                }
            }
        }

        stream.Reverse(started_at);
        stream.StepBack(index - started_at);

        if (power != 0) {
            stream.InsertAt(DigitUtils::DigitChar::Dot, (started_at + SizeT{1}));
            insertPowerOfTen(stream, power, is_positive_exp);
        }
    }